

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

void Kit_SopDivideInternal
               (Kit_Sop_t *cSop,Kit_Sop_t *cDiv,Kit_Sop_t *vQuo,Kit_Sop_t *vRem,Vec_Int_t *vMemory)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  bool bVar7;
  int local_54;
  int nCubesRem;
  int k2;
  int k;
  int i2;
  int i;
  uint uQuo;
  uint uDiv2;
  uint uCube2;
  uint uDiv;
  uint uCube;
  Vec_Int_t *vMemory_local;
  Kit_Sop_t *vRem_local;
  Kit_Sop_t *vQuo_local;
  Kit_Sop_t *cDiv_local;
  Kit_Sop_t *cSop_local;
  
  uQuo = 0;
  iVar1 = Kit_SopCubeNum(cSop);
  iVar2 = Kit_SopCubeNum(cDiv);
  if (iVar1 < iVar2) {
    __assert_fail("Kit_SopCubeNum(cSop) >= Kit_SopCubeNum(cDiv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitSop.c"
                  ,0xb8,
                  "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Kit_SopCubeNum(cDiv);
  if (iVar1 == 1) {
    Kit_SopDivideByCube(cSop,cDiv,vQuo,vRem,vMemory);
  }
  else {
    vQuo->nCubes = 0;
    iVar1 = Kit_SopCubeNum(cSop);
    iVar2 = Kit_SopCubeNum(cDiv);
    puVar6 = Vec_IntFetch(vMemory,iVar1 / iVar2);
    vQuo->pCubes = puVar6;
    k = 0;
    while( true ) {
      iVar1 = Kit_SopCubeNum(cSop);
      bVar7 = false;
      if (k < iVar1) {
        uCube2 = Kit_SopCube(cSop,k);
        bVar7 = uCube2 != 0;
      }
      if (!bVar7) break;
      iVar1 = Kit_CubeIsMarked(uCube2);
      if (iVar1 == 0) {
        uDiv2 = 0xffffffff;
        nCubesRem = 0;
        while( true ) {
          iVar1 = Kit_SopCubeNum(cDiv);
          bVar7 = false;
          if (nCubesRem < iVar1) {
            uDiv2 = Kit_SopCube(cDiv,nCubesRem);
            bVar7 = uDiv2 != 0;
          }
          if ((!bVar7) || (iVar1 = Kit_CubeContains(uCube2,uDiv2), iVar1 != 0)) break;
          nCubesRem = nCubesRem + 1;
        }
        iVar1 = Kit_SopCubeNum(cDiv);
        if (nCubesRem != iVar1) {
          uVar5 = Kit_CubeSharp(uCube2,uDiv2);
          i = -1;
          local_54 = 0;
          while( true ) {
            iVar1 = Kit_SopCubeNum(cDiv);
            bVar7 = false;
            if (local_54 < iVar1) {
              i = Kit_SopCube(cDiv,local_54);
              bVar7 = i != 0;
            }
            if (!bVar7) break;
            if (local_54 != nCubesRem) {
              k2 = 0;
              while( true ) {
                iVar1 = Kit_SopCubeNum(cSop);
                bVar7 = false;
                if (k2 < iVar1) {
                  uQuo = Kit_SopCube(cSop,k2);
                  bVar7 = uQuo != 0;
                }
                if ((!bVar7) ||
                   (((iVar1 = Kit_CubeIsMarked(uQuo), iVar1 == 0 &&
                     (iVar1 = Kit_CubeContains(uQuo,i), iVar1 != 0)) &&
                    (uVar3 = Kit_CubeSharp(uQuo,i), uVar5 == uVar3)))) break;
                k2 = k2 + 1;
              }
              iVar1 = Kit_SopCubeNum(cSop);
              if (k2 == iVar1) break;
            }
            local_54 = local_54 + 1;
          }
          iVar1 = Kit_SopCubeNum(cDiv);
          if (local_54 == iVar1) {
            Kit_SopPushCube(vQuo,uVar5);
            uVar3 = Kit_CubeMark(uCube2);
            Kit_SopWriteCube(cSop,uVar3,k);
            local_54 = 0;
            while( true ) {
              iVar1 = Kit_SopCubeNum(cDiv);
              bVar7 = false;
              if (local_54 < iVar1) {
                i = Kit_SopCube(cDiv,local_54);
                bVar7 = i != 0;
              }
              if (!bVar7) break;
              if (local_54 != nCubesRem) {
                k2 = 0;
                while( true ) {
                  iVar1 = Kit_SopCubeNum(cSop);
                  bVar7 = false;
                  if (k2 < iVar1) {
                    uQuo = Kit_SopCube(cSop,k2);
                    bVar7 = uQuo != 0;
                  }
                  if ((!bVar7) ||
                     (((iVar1 = Kit_CubeIsMarked(uQuo), iVar1 == 0 &&
                       (iVar1 = Kit_CubeContains(uQuo,i), iVar1 != 0)) &&
                      (uVar3 = Kit_CubeSharp(uQuo,i), uVar5 == uVar3)))) break;
                  k2 = k2 + 1;
                }
                iVar1 = Kit_SopCubeNum(cSop);
                if (iVar1 <= k2) {
                  __assert_fail("i2 < Kit_SopCubeNum(cSop)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitSop.c"
                                ,0xfe,
                                "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                               );
                }
                uVar3 = Kit_CubeMark(uQuo);
                Kit_SopWriteCube(cSop,uVar3,k2);
              }
              local_54 = local_54 + 1;
            }
          }
        }
      }
      k = k + 1;
    }
    iVar4 = Kit_SopCubeNum(cSop);
    iVar1 = Kit_SopCubeNum(vQuo);
    iVar2 = Kit_SopCubeNum(cDiv);
    iVar4 = iVar4 - iVar1 * iVar2;
    vRem->nCubes = 0;
    puVar6 = Vec_IntFetch(vMemory,iVar4);
    vRem->pCubes = puVar6;
    k = 0;
    while( true ) {
      iVar1 = Kit_SopCubeNum(cSop);
      bVar7 = false;
      if (k < iVar1) {
        uCube2 = Kit_SopCube(cSop,k);
        bVar7 = uCube2 != 0;
      }
      if (!bVar7) break;
      iVar1 = Kit_CubeIsMarked(uCube2);
      if (iVar1 == 0) {
        Kit_SopPushCube(vRem,uCube2);
      }
      else {
        uVar5 = Kit_CubeUnmark(uCube2);
        Kit_SopWriteCube(cSop,uVar5,k);
      }
      k = k + 1;
    }
    iVar1 = Kit_SopCubeNum(vRem);
    if (iVar4 != iVar1) {
      __assert_fail("nCubesRem == Kit_SopCubeNum(vRem)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitSop.c"
                    ,0x114,
                    "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                   );
    }
  }
  return;
}

Assistant:

void Kit_SopDivideInternal( Kit_Sop_t * cSop, Kit_Sop_t * cDiv, Kit_Sop_t * vQuo, Kit_Sop_t * vRem, Vec_Int_t * vMemory )
{
    unsigned uCube, uDiv;
    unsigned uCube2 = 0; // Suppress "might be used uninitialized"
    unsigned uDiv2, uQuo;
    int i, i2, k, k2, nCubesRem;
    assert( Kit_SopCubeNum(cSop) >= Kit_SopCubeNum(cDiv) );
    // consider special case
    if ( Kit_SopCubeNum(cDiv) == 1 )
    {
        Kit_SopDivideByCube( cSop, cDiv, vQuo, vRem, vMemory );
        return;
    }
    // allocate quotient
    vQuo->nCubes = 0;
    vQuo->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) / Kit_SopCubeNum(cDiv) );
    // for each cube of the cover
    // it either belongs to the quotient or to the remainder
    Kit_SopForEachCube( cSop, uCube, i )
    {
        // skip taken cubes
        if ( Kit_CubeIsMarked(uCube) )
            continue;
        // find a matching cube in the divisor
        uDiv = ~0;
        Kit_SopForEachCube( cDiv, uDiv, k )
            if ( Kit_CubeContains( uCube, uDiv ) )
                break;
        // the cube is not found 
        if ( k == Kit_SopCubeNum(cDiv) )
            continue;
        // the quotient cube exists
        uQuo = Kit_CubeSharp( uCube, uDiv );
        // find corresponding cubes for other cubes of the divisor
        uDiv2 = ~0;
        Kit_SopForEachCube( cDiv, uDiv2, k2 )
        {
            if ( k2 == k )
                continue;
            // find a matching cube
            Kit_SopForEachCube( cSop, uCube2, i2 )
            {
                // skip taken cubes
                if ( Kit_CubeIsMarked(uCube2) )
                    continue;
                // check if the cube can be used
                if ( Kit_CubeContains( uCube2, uDiv2 ) && uQuo == Kit_CubeSharp( uCube2, uDiv2 ) )
                    break;
            }
            // the case when the cube is not found
            if ( i2 == Kit_SopCubeNum(cSop) )
                break;
        }
        // we did not find some cubes - continue looking at other cubes
        if ( k2 != Kit_SopCubeNum(cDiv) )
            continue;
        // we found all cubes - add the quotient cube
        Kit_SopPushCube( vQuo, uQuo );

        // mark the first cube
        Kit_SopWriteCube( cSop, Kit_CubeMark(uCube), i );
        // mark other cubes that have this quotient
        Kit_SopForEachCube( cDiv, uDiv2, k2 )
        {
            if ( k2 == k )
                continue;
            // find a matching cube
            Kit_SopForEachCube( cSop, uCube2, i2 )
            {
                // skip taken cubes
                if ( Kit_CubeIsMarked(uCube2) )
                    continue;
                // check if the cube can be used
                if ( Kit_CubeContains( uCube2, uDiv2 ) && uQuo == Kit_CubeSharp( uCube2, uDiv2 ) )
                    break;
            }
            assert( i2 < Kit_SopCubeNum(cSop) );
            // the cube is found, mark it 
            // (later we will add all unmarked cubes to the remainder)
            Kit_SopWriteCube( cSop, Kit_CubeMark(uCube2), i2 );
        }
    }
    // determine the number of cubes in the remainder
    nCubesRem = Kit_SopCubeNum(cSop) - Kit_SopCubeNum(vQuo) * Kit_SopCubeNum(cDiv);
    // allocate remainder
    vRem->nCubes = 0;
    vRem->pCubes = Vec_IntFetch( vMemory, nCubesRem );
    // finally add the remaining unmarked cubes to the remainder 
    // and clean the marked cubes in the cover
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( !Kit_CubeIsMarked(uCube) )
        {
            Kit_SopPushCube( vRem, uCube );
            continue;
        }
        Kit_SopWriteCube( cSop, Kit_CubeUnmark(uCube), i );
    }
    assert( nCubesRem == Kit_SopCubeNum(vRem) );
}